

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O0

int d_updirectory(int f,int n)

{
  int iVar1;
  buffer *bp_00;
  char local_428 [8];
  char fname [1024];
  int ret;
  buffer *bp;
  int n_local;
  int f_local;
  
  fname._1020_4_ = snprintf(local_428,0x400,"%s..",curbp->b_fname);
  if (((int)fname._1020_4_ < 0) || (0x3ff < (uint)fname._1020_4_)) {
    n_local = 2;
  }
  else {
    bp_00 = dired_(local_428);
    if (bp_00 == (buffer *)0x0) {
      n_local = 0;
    }
    else {
      curbp = bp_00;
      iVar1 = showbuffer(bp_00,curwp,8);
      if (iVar1 == 1) {
        if (bp_00->b_fname[0] == '\0') {
          n_local = readin(local_428);
        }
        else {
          n_local = 1;
        }
      }
      else {
        n_local = 0;
      }
    }
  }
  return n_local;
}

Assistant:

int
d_updirectory(int f, int n)
{
	struct buffer	*bp;
	int		 ret;
	char		 fname[NFILEN];

	ret = snprintf(fname, sizeof(fname), "%s..", curbp->b_fname);
	if (ret < 0 || (size_t)ret >= sizeof(fname))
		return (ABORT); /* Name is too long. */

	bp = dired_(fname);
	if (bp == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] != 0)
		return (TRUE);
	return (readin(fname));
}